

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O3

bool __thiscall
SocketInternals::Open(SocketInternals *this,string *host,string *multicast,unsigned_short port)

{
  int iVar1;
  uint uVar2;
  ostream *poVar3;
  uint uVar4;
  ushort uVar5;
  bool bVar6;
  int packetInfo;
  unsigned_long ret;
  int broadcastEnable;
  uint32_t in_stack_ffffffffffffff9c;
  undefined4 local_5c;
  in_addr local_58;
  undefined4 uStack_54;
  long local_50;
  long local_48 [2];
  undefined4 local_34;
  
  (this->ServerAddr).sin_family = 2;
  uVar5 = port << 8 | port >> 8;
  (this->ServerAddr).sin_port = uVar5;
  inet_pton(2,(host->_M_dataplus)._M_p,&local_58);
  (this->ServerAddr).sin_addr.s_addr = local_58.s_addr;
  iVar1 = socket(2,2,0);
  this->SocketFD = iVar1;
  if (iVar1 == -1) {
    poVar3 = this->outStr;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Failed to open UDP socket",0x19);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    bVar6 = false;
  }
  else {
    local_34 = 1;
    local_5c = 1;
    iVar1 = setsockopt(iVar1,1,6,&local_34,4);
    bVar6 = iVar1 == 0;
    if (bVar6) {
      iVar1 = setsockopt(this->SocketFD,0,8,&local_5c,4);
      if (iVar1 != 0) {
        poVar3 = this->outStr;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"Open: Failed to set SOCKET packet info option",0x2d);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
      (this->ServerAddrBroadcast).sin_family = 2;
      (this->ServerAddrBroadcast).sin_port = uVar5;
      uVar2 = (this->ServerAddr).sin_addr.s_addr;
      uVar4 = uVar2 & 0xff;
      if (uVar4 < 0x80) {
        uVar2 = uVar2 | 0xffffff00;
      }
      else if (uVar4 < 0xc0) {
        uVar2 = uVar2 | 0xffff0000;
      }
      else {
        uVar2 = uVar2 | 0xff000000;
        if (0xdf < uVar4) {
          uVar2 = 0xffffffff;
        }
      }
      (this->ServerAddrBroadcast).sin_addr.s_addr = uVar2;
      (this->ServerAddrMulticast).sin_family = 2;
      (this->ServerAddrMulticast).sin_port = uVar5;
      inet_pton(2,(multicast->_M_dataplus)._M_p,&local_58);
      (this->ServerAddrMulticast).sin_addr.s_addr = local_58.s_addr;
      poVar3 = this->outStr;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Server IP: ",0xb);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(host->_M_dataplus)._M_p,host->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", Port: ",8);
      *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      poVar3 = this->outStr;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Broadcast IP: ",0xe);
      EthUdpPort::IP_String_abi_cxx11_(in_stack_ffffffffffffff9c);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(char *)CONCAT44(uStack_54,local_58.s_addr),local_50);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if ((long *)CONCAT44(uStack_54,local_58.s_addr) != local_48) {
        operator_delete((long *)CONCAT44(uStack_54,local_58.s_addr),local_48[0] + 1);
      }
      poVar3 = this->outStr;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Multicast IP: ",0xe);
      EthUdpPort::IP_String_abi_cxx11_(in_stack_ffffffffffffff9c);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(char *)CONCAT44(uStack_54,local_58.s_addr),local_50);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if ((long *)CONCAT44(uStack_54,local_58.s_addr) != local_48) {
        operator_delete((long *)CONCAT44(uStack_54,local_58.s_addr),local_48[0] + 1);
      }
    }
    else {
      poVar3 = this->outStr;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"Open: Failed to set SOCKET broadcast option",0x2b);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
  }
  return bVar6;
}

Assistant:

bool SocketInternals::Open(const std::string &host, const std::string &multicast, unsigned short port)
{
#ifdef _MSC_VER
    WSADATA wsaData;
    int retval = WSAStartup(WINSOCKVERSION, &wsaData);
    if (retval != 0) {
        outStr << "WSAStartup failed with error code " << retval << std::endl;
        return false;
    }
#endif
    ServerAddr.sin_family = AF_INET;
    ServerAddr.sin_port = htons(port);
    ServerAddr.sin_addr.s_addr = EthUdpPort::IP_ULong(host);

    // Open UDP socket
    SocketFD = socket(PF_INET, SOCK_DGRAM, 0);
    if (SocketFD == INVALID_SOCKET) {
        outStr << "Failed to open UDP socket" << std::endl;
        return false;
    }

    // Enable broadcasts
#ifdef _MSC_VER
    BOOL broadcastEnable = TRUE;
    DWORD packetInfo = 1;
    if (setsockopt(SocketFD, SOL_SOCKET, SO_BROADCAST, reinterpret_cast<const char *>(&broadcastEnable),
                   sizeof(broadcastEnable)) != 0) {
        outStr << "Open: Failed to set SOCKET broadcast option" << std::endl;
        return false;
    }

    if (setsockopt(SocketFD, IPPROTO_IP, IP_PKTINFO, reinterpret_cast<const char *>(&packetInfo),
                   sizeof(packetInfo)) != 0) {
        outStr << "Open: Failed to set SOCKET packet info option" << std::endl;
    }
#else
    int broadcastEnable = 1;
    int packetInfo = 1;
    if (setsockopt(SocketFD, SOL_SOCKET, SO_BROADCAST, &broadcastEnable, sizeof(broadcastEnable)) != 0) {
        outStr << "Open: Failed to set SOCKET broadcast option" << std::endl;
        return false;
    }

    if (setsockopt(SocketFD, IPPROTO_IP, IP_PKTINFO, &packetInfo, sizeof(packetInfo)) != 0) {
        outStr << "Open: Failed to set SOCKET packet info option" << std::endl;
    }
#endif

    // Determine the broadcast address. For simplicity, we assume that this is a Class A, B, or C network,
    // as defined by the InterNIC:
    //    Class A: first byte is 0-127, default subnet mask is 255.0.0.0
    //    Class B: first byte is 128-191, default subnet mask is 255.255.0.0
    //    Class C: first byte is 192-223, default subnet mask is 255.255.255.0
    // If the first byte is greater than 223, we use the global broadcast address, 255.255.255.255

    ServerAddrBroadcast.sin_family = AF_INET;
    ServerAddrBroadcast.sin_port = htons(port);
    unsigned char firstByte = static_cast<unsigned char>(ServerAddr.sin_addr.s_addr&0x000000ff);
    if (firstByte < 128)
        ServerAddrBroadcast.sin_addr.s_addr = ServerAddr.sin_addr.s_addr|0xffffff00;
    else if (firstByte < 192)
        ServerAddrBroadcast.sin_addr.s_addr = ServerAddr.sin_addr.s_addr|0xffff0000;
    else if (firstByte < 224)
        ServerAddrBroadcast.sin_addr.s_addr = ServerAddr.sin_addr.s_addr|0xff000000;
    else
        ServerAddrBroadcast.sin_addr.s_addr = 0xffffffff;

    // UDP Multicast address
    ServerAddrMulticast.sin_family = AF_INET;
    ServerAddrMulticast.sin_port = htons(port);
    ServerAddrMulticast.sin_addr.s_addr = EthUdpPort::IP_ULong(multicast);

    outStr << "Server IP: " << host << ", Port: " << std::dec << port << std::endl;
    outStr << "Broadcast IP: " << EthUdpPort::IP_String(ServerAddrBroadcast.sin_addr.s_addr) << std::endl;
    outStr << "Multicast IP: " << EthUdpPort::IP_String(ServerAddrMulticast.sin_addr.s_addr) << std::endl;
    return true;
}